

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2.cpp
# Opt level: O0

int32_t normalizeSecondAndAppend
                  (UNormalizer2 *norm2,UChar *first,int32_t firstLength,int32_t firstCapacity,
                  UChar *second,int32_t secondLength,UBool doNormalize,UErrorCode *pErrorCode)

{
  uint uVar1;
  UBool UVar2;
  int32_t iVar3;
  int iVar4;
  int32_t iVar5;
  UChar *local_1b0;
  long *local_190;
  Char16Ptr local_170;
  ConstChar16Ptr local_168;
  undefined1 local_160 [8];
  UnicodeString secondString;
  undefined1 local_118 [8];
  ReorderingBuffer buffer;
  UnicodeString safeMiddle;
  Normalizer2WithImpl *n2wi;
  Normalizer2 *n2;
  undefined1 local_78 [8];
  UnicodeString firstString;
  int32_t secondLength_local;
  UChar *second_local;
  int32_t firstCapacity_local;
  int32_t firstLength_local;
  UChar *first_local;
  UNormalizer2 *norm2_local;
  
  firstString.fUnion._52_4_ = secondLength;
  UVar2 = U_FAILURE(*pErrorCode);
  if (UVar2 != '\0') {
    return 0;
  }
  if (second == (UChar *)0x0) {
    if (firstString.fUnion._52_4_ != 0) goto LAB_0033ac2a;
  }
  else if ((int)firstString.fUnion._52_4_ < -1) goto LAB_0033ac2a;
  if (first == (UChar *)0x0) {
    if ((firstCapacity != 0) || (firstLength != 0)) goto LAB_0033ac2a;
  }
  else if ((firstCapacity < 0) || (firstLength < -1)) goto LAB_0033ac2a;
  if ((first != second) || (first == (UChar *)0x0)) {
    icu_63::UnicodeString::UnicodeString((UnicodeString *)local_78,first,firstLength,firstCapacity);
    iVar3 = icu_63::UnicodeString::length((UnicodeString *)local_78);
    if (firstString.fUnion._52_4_ != 0) {
      if (norm2 == (UNormalizer2 *)0x0) {
        local_190 = (long *)0x0;
      }
      else {
        local_190 = (long *)__dynamic_cast(norm2,&icu_63::Normalizer2::typeinfo,
                                           &icu_63::Normalizer2WithImpl::typeinfo,0);
      }
      if (local_190 == (long *)0x0) {
        uVar1 = (uint)firstString.fUnion._52_4_ >> 0x1f;
        icu_63::ConstChar16Ptr::ConstChar16Ptr(&local_168,second);
        icu_63::UnicodeString::UnicodeString
                  ((UnicodeString *)local_160,(byte)uVar1,&local_168,firstString.fUnion._52_4_);
        icu_63::ConstChar16Ptr::~ConstChar16Ptr(&local_168);
        if (doNormalize == '\0') {
          (**(code **)(*(long *)norm2 + 0x30))(norm2,local_78,local_160,pErrorCode);
        }
        else {
          (**(code **)(*(long *)norm2 + 0x28))(norm2,local_78,local_160,pErrorCode);
        }
        icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_160);
      }
      else {
        icu_63::UnicodeString::UnicodeString((UnicodeString *)&buffer.codePointLimit);
        icu_63::ReorderingBuffer::ReorderingBuffer
                  ((ReorderingBuffer *)local_118,(Normalizer2Impl *)local_190[1],
                   (UnicodeString *)local_78);
        iVar4 = icu_63::ReorderingBuffer::init
                          ((ReorderingBuffer *)local_118,
                           (EVP_PKEY_CTX *)(ulong)(uint)(iVar3 + 1 + firstString.fUnion._52_4_));
        if ((char)iVar4 != '\0') {
          if ((int)firstString.fUnion._52_4_ < 0) {
            local_1b0 = (UChar *)0x0;
          }
          else {
            local_1b0 = second + (int)firstString.fUnion._52_4_;
          }
          (**(code **)(*local_190 + 0x98))
                    (local_190,second,local_1b0,(int)doNormalize,&buffer.codePointLimit,local_118,
                     pErrorCode);
        }
        icu_63::ReorderingBuffer::~ReorderingBuffer((ReorderingBuffer *)local_118);
        UVar2 = U_FAILURE(*pErrorCode);
        if (((UVar2 != '\0') ||
            (iVar5 = icu_63::UnicodeString::length((UnicodeString *)local_78), firstCapacity < iVar5
            )) && (first != (UChar *)0x0)) {
          iVar5 = icu_63::UnicodeString::length((UnicodeString *)&buffer.codePointLimit);
          icu_63::Char16Ptr::Char16Ptr
                    ((Char16Ptr *)((long)&secondString.fUnion + 0x30),
                     first + ((long)iVar3 - (long)iVar5));
          icu_63::UnicodeString::extract
                    ((UnicodeString *)&buffer.codePointLimit,0,0x7fffffff,
                     (Char16Ptr *)((long)&secondString.fUnion + 0x30),0);
          icu_63::Char16Ptr::~Char16Ptr((Char16Ptr *)((long)&secondString.fUnion + 0x30));
          if (iVar3 < firstCapacity) {
            first[iVar3] = L'\0';
          }
        }
        icu_63::UnicodeString::~UnicodeString((UnicodeString *)&buffer.codePointLimit);
      }
    }
    icu_63::Char16Ptr::Char16Ptr(&local_170,first);
    iVar3 = icu_63::UnicodeString::extract
                      ((UnicodeString *)local_78,&local_170,firstCapacity,pErrorCode);
    icu_63::Char16Ptr::~Char16Ptr(&local_170);
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_78);
    return iVar3;
  }
LAB_0033ac2a:
  *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
  return 0;
}

Assistant:

static int32_t
normalizeSecondAndAppend(const UNormalizer2 *norm2,
                         UChar *first, int32_t firstLength, int32_t firstCapacity,
                         const UChar *second, int32_t secondLength,
                         UBool doNormalize,
                         UErrorCode *pErrorCode) {
    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if( (second==NULL ? secondLength!=0 : secondLength<-1) ||
        (first==NULL ? (firstCapacity!=0 || firstLength!=0) :
                       (firstCapacity<0 || firstLength<-1)) ||
        (first==second && first!=NULL)
    ) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    UnicodeString firstString(first, firstLength, firstCapacity);
    firstLength=firstString.length();  // In case it was -1.
    // secondLength==0: Nothing to do, and n2wi->normalizeAndAppend(NULL, NULL, buffer, ...) would crash.
    if(secondLength!=0) {
        const Normalizer2 *n2=(const Normalizer2 *)norm2;
        const Normalizer2WithImpl *n2wi=dynamic_cast<const Normalizer2WithImpl *>(n2);
        if(n2wi!=NULL) {
            // Avoid duplicate argument checking and support NUL-terminated src.
            UnicodeString safeMiddle;
            {
                ReorderingBuffer buffer(n2wi->impl, firstString);
                if(buffer.init(firstLength+secondLength+1, *pErrorCode)) {  // destCapacity>=-1
                    n2wi->normalizeAndAppend(second, secondLength>=0 ? second+secondLength : NULL,
                                             doNormalize, safeMiddle, buffer, *pErrorCode);
                }
            }  // The ReorderingBuffer destructor finalizes firstString.
            if(U_FAILURE(*pErrorCode) || firstString.length()>firstCapacity) {
                // Restore the modified suffix of the first string.
                // This does not restore first[] array contents between firstLength and firstCapacity.
                // (That might be uninitialized memory, as far as we know.)
                if(first!=NULL) { /* don't dereference NULL */
                  safeMiddle.extract(0, 0x7fffffff, first+firstLength-safeMiddle.length());
                  if(firstLength<firstCapacity) {
                    first[firstLength]=0;  // NUL-terminate in case it was originally.
                  }
                }
            }
        } else {
            UnicodeString secondString(secondLength<0, second, secondLength);
            if(doNormalize) {
                n2->normalizeSecondAndAppend(firstString, secondString, *pErrorCode);
            } else {
                n2->append(firstString, secondString, *pErrorCode);
            }
        }
    }
    return firstString.extract(first, firstCapacity, *pErrorCode);
}